

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase1477::run(TestCase1477 *this)

{
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  Builder builder_00;
  CapTableReader *pCVar1;
  int iVar2;
  WirePointer *pWVar3;
  SegmentBuilder *pSVar4;
  Reader oldRoot;
  Builder root;
  Reader oldSub;
  Reader oldSub2;
  MallocMessageBuilder builder;
  PointerBuilder local_218;
  long lStack_200;
  undefined4 local_1f8;
  ushort uStack_1f4;
  undefined2 uStack_1f2;
  int iStack_1f0;
  undefined4 uStack_1ec;
  StructBuilder local_1e8;
  StructReader local_1c0;
  undefined1 local_190 [48];
  SegmentBuilder *local_160;
  CapTableReader *pCStack_158;
  WirePointer *in_stack_fffffffffffffeb0;
  SegmentReader *in_stack_fffffffffffffeb8;
  CapTableReader *in_stack_fffffffffffffec0;
  WirePointer *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined8 local_128;
  undefined8 uStack_120;
  PointerReader local_118;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1c0,&local_f8.super_MessageBuilder);
  local_218.pointer = (WirePointer *)local_1c0.data;
  local_218.segment = (SegmentBuilder *)local_1c0.segment;
  local_218.capTable = (CapTableBuilder *)local_1c0.capTable;
  PointerBuilder::initStruct(&local_1e8,&local_218,(StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffeb8;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffeb0;
  builder_00._builder.data = in_stack_fffffffffffffec0;
  builder_00._builder.pointers = in_stack_fffffffffffffec8;
  builder_00._builder.dataSize = in_stack_fffffffffffffed0;
  builder_00._builder.pointerCount = (short)in_stack_fffffffffffffed4;
  builder_00._builder._38_2_ = SUB42(in_stack_fffffffffffffed4,2);
  initTestMessage(builder_00);
  StructBuilder::asReader(&local_1e8);
  reader._reader.pointerCount = uStack_1f4;
  reader._reader.dataSize = local_1f8;
  reader._reader._38_2_ = uStack_1f2;
  reader._reader._44_4_ = uStack_1ec;
  reader._reader.nestingLimit = iStack_1f0;
  reader._reader.capTable = &(local_218.capTable)->super_CapTableReader;
  reader._reader.segment = &(local_218.segment)->super_SegmentReader;
  reader._reader.data = local_218.pointer;
  reader._reader.pointers = (WirePointer *)lStack_200;
  checkTestMessage(reader);
  if (uStack_1f4 < 3) {
    iVar2 = 0x7fffffff;
    pCVar1 = (CapTableReader *)0x0;
    pWVar3 = (WirePointer *)0x0;
    pSVar4 = (SegmentBuilder *)0x0;
  }
  else {
    pWVar3 = (WirePointer *)(lStack_200 + 0x10);
    pCVar1 = &(local_218.capTable)->super_CapTableReader;
    pSVar4 = local_218.segment;
    iVar2 = iStack_1f0;
  }
  PointerReader::getStruct(&local_1c0,(PointerReader *)&stack0xfffffffffffffeb8,(word *)0x0);
  if (uStack_1f4 < 0x12) {
    local_118.nestingLimit = 0x7fffffff;
    local_118.capTable = (CapTableReader *)0x0;
    local_118.pointer = (WirePointer *)0x0;
    local_118.segment = (SegmentReader *)0x0;
  }
  else {
    local_118.pointer = (WirePointer *)(lStack_200 + 0x88);
    local_118.capTable = &(local_218.capTable)->super_CapTableReader;
    local_118.segment = &(local_218.segment)->super_SegmentReader;
    local_118.nestingLimit = iStack_1f0;
  }
  PointerReader::getList((ListReader *)local_190,&local_118,INLINE_COMPOSITE,(word *)0x0);
  ListReader::getStructElement((StructReader *)&stack0xfffffffffffffeb8,(ListReader *)local_190,0);
  MessageBuilder::getRootInternal((Builder *)&local_160,&local_f8.super_MessageBuilder);
  local_118.segment = &local_160->super_SegmentReader;
  local_118.capTable = pCStack_158;
  PointerBuilder::initStruct
            ((StructBuilder *)local_190,(PointerBuilder *)&local_118,(StructSize)0x140006);
  local_1e8.segment = (SegmentBuilder *)local_190._0_8_;
  local_1e8.capTable = (CapTableBuilder *)local_190._8_8_;
  local_1e8.data = (void *)local_190._16_8_;
  local_1e8.pointers = (WirePointer *)local_190._24_8_;
  local_1e8.dataSize = local_190._32_4_;
  local_1e8.pointerCount = local_190._36_2_;
  local_1e8._38_2_ = local_190._38_2_;
  reader_00._reader.pointerCount = uStack_1f4;
  reader_00._reader.dataSize = local_1f8;
  reader_00._reader._38_2_ = uStack_1f2;
  reader_00._reader._44_4_ = uStack_1ec;
  reader_00._reader.nestingLimit = iStack_1f0;
  reader_00._reader.capTable = &(local_218.capTable)->super_CapTableReader;
  reader_00._reader.segment = &(local_218.segment)->super_SegmentReader;
  reader_00._reader.data = local_218.pointer;
  reader_00._reader.pointers = (WirePointer *)lStack_200;
  checkTestMessageAllZero(reader_00);
  reader_01._reader.capTable = local_1c0.capTable;
  reader_01._reader.segment = local_1c0.segment;
  reader_01._reader.data = local_1c0.data;
  reader_01._reader.pointers = local_1c0.pointers;
  reader_01._reader.dataSize = local_1c0.dataSize;
  reader_01._reader.pointerCount = local_1c0.pointerCount;
  reader_01._reader._38_2_ = local_1c0._38_2_;
  reader_01._reader.nestingLimit = local_1c0.nestingLimit;
  reader_01._reader._44_4_ = local_1c0._44_4_;
  checkTestMessageAllZero(reader_01);
  reader_02._reader.pointers._4_4_ = in_stack_fffffffffffffed4;
  reader_02._reader.pointers._0_4_ = iVar2;
  reader_02._reader.capTable = pCVar1;
  reader_02._reader.segment = &pSVar4->super_SegmentReader;
  reader_02._reader.data = pWVar3;
  reader_02._reader._32_8_ = local_128;
  reader_02._reader._40_8_ = uStack_120;
  checkTestMessageAllZero(reader_02);
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(Encoding, ZeroOldObject) {
  MallocMessageBuilder builder;

  auto root = builder.initRoot<TestAllTypes>();
  initTestMessage(root);

  auto oldRoot = root.asReader();
  checkTestMessage(oldRoot);

  auto oldSub = oldRoot.getStructField();
  auto oldSub2 = oldRoot.getStructList()[0];

  root = builder.initRoot<TestAllTypes>();
  checkTestMessageAllZero(oldRoot);
  checkTestMessageAllZero(oldSub);
  checkTestMessageAllZero(oldSub2);
}